

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O2

int bgzf_index_load(BGZF *fp,char *bname,char *suffix)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *__dest;
  FILE *pFVar4;
  bgzidx_t *pbVar5;
  bgzidx1_t *pbVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint64_t x;
  FILE *local_40;
  BGZF *local_38;
  
  if (suffix == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar2 = strlen(bname);
    sVar3 = strlen(suffix);
    iVar9 = (int)sVar2;
    __dest = (char *)malloc((long)((int)sVar3 + iVar9 + 1));
    if (__dest == (char *)0x0) {
      return -1;
    }
    memcpy(__dest,bname,(long)iVar9);
    memcpy(__dest + iVar9,suffix,(long)((sVar3 << 0x20) + 0x100000000) >> 0x20);
  }
  iVar9 = -1;
  if (__dest != (char *)0x0) {
    bname = __dest;
  }
  pFVar4 = fopen(bname,"rb");
  free(__dest);
  if (pFVar4 != (FILE *)0x0) {
    local_40 = pFVar4;
    pbVar5 = (bgzidx_t *)calloc(1,0x18);
    fp->idx = pbVar5;
    sVar2 = fread(&x,1,8,local_40);
    iVar9 = -1;
    if (sVar2 == 8) {
      uVar8 = (uint)(byte)(x >> 0x38) | ((uint)(x >> 0x20) & 0xff0000) >> 8 |
              (uint)(x >> 0x18) & 0xff0000 | (uint)(x >> 8) & 0xff000000;
      if (((undefined1  [96])*fp & (undefined1  [96])0xc0000) == (undefined1  [96])0x0) {
        uVar8 = (uint)x;
      }
      iVar9 = uVar8 + 1;
      pbVar5 = fp->idx;
      pbVar5->moffs = iVar9;
      pbVar5->noffs = iVar9;
      pbVar6 = (bgzidx1_t *)malloc((long)iVar9 << 4);
      pbVar5->offs = pbVar6;
      pbVar6->uaddr = 0;
      pbVar6->caddr = 0;
      local_38 = fp;
      if ((fp->field_0x2 & 0xc) == 0) {
        lVar10 = 0;
        iVar1 = 0;
        for (lVar11 = 1; pFVar4 = local_40, lVar7 = (long)iVar9, lVar11 < lVar7; lVar11 = lVar11 + 1
            ) {
          sVar2 = fread(&x,1,8,local_40);
          *(uint64_t *)((long)&fp->idx->offs[1].caddr + lVar10) = x;
          sVar3 = fread(&x,1,8,pFVar4);
          iVar1 = (int)sVar3 + iVar1 + (int)sVar2;
          pbVar5 = fp->idx;
          *(uint64_t *)((long)&pbVar5->offs[1].uaddr + lVar10) = x;
          iVar9 = pbVar5->noffs;
          lVar10 = lVar10 + 0x10;
        }
      }
      else {
        lVar10 = 0;
        iVar1 = 0;
        for (lVar11 = 1; pFVar4 = local_40, lVar7 = (long)iVar9, lVar11 < lVar7; lVar11 = lVar11 + 1
            ) {
          sVar2 = fread(&x,1,8,local_40);
          *(uint64_t *)((long)&fp->idx->offs[1].caddr + lVar10) =
               x >> 0x38 | (x & 0xff000000000000) >> 0x28 | (x & 0xff0000000000) >> 0x18 |
               (x & 0xff00000000) >> 8 | (x & 0xff000000) << 8 | (x & 0xff0000) << 0x18 |
               (x & 0xff00) << 0x28 | x << 0x38;
          sVar3 = fread(&x,1,8,pFVar4);
          iVar1 = (int)sVar3 + iVar1 + (int)sVar2;
          pbVar5 = fp->idx;
          *(uint64_t *)((long)&pbVar5->offs[1].uaddr + lVar10) =
               x >> 0x38 | (x & 0xff000000000000) >> 0x28 | (x & 0xff0000000000) >> 0x18 |
               (x & 0xff00000000) >> 8 | (x & 0xff000000) << 8 | (x & 0xff0000) << 0x18 |
               (x & 0xff00) << 0x28 | x << 0x38;
          iVar9 = pbVar5->noffs;
          lVar10 = lVar10 + 0x10;
        }
      }
      iVar9 = -1;
      if (lVar7 * 0x10 + -0x10 == (long)iVar1) {
        fclose(local_40);
        iVar9 = 0;
      }
    }
  }
  return iVar9;
}

Assistant:

int bgzf_index_load(BGZF *fp, const char *bname, const char *suffix)
{
    char *tmp = NULL;
    if ( suffix )
    {
        int blen = strlen(bname);
        int slen = strlen(suffix);
        tmp = (char*) malloc(blen + slen + 1);
        if ( !tmp ) return -1;
        memcpy(tmp,bname,blen);
        memcpy(tmp+blen,suffix,slen+1);
    }

    FILE *idx = fopen(tmp?tmp:bname,"rb");
    if ( tmp ) free(tmp);
    if ( !idx ) return -1;

    fp->idx = (bgzidx_t*) calloc(1,sizeof(bgzidx_t));
    uint64_t x;
    if ( fread(&x, 1, sizeof(x), idx) != sizeof(x) ) return -1;

    fp->idx->noffs = fp->idx->moffs = 1 + (fp->is_be ? ed_swap_8(x) : x);
    fp->idx->offs  = (bgzidx1_t*) malloc(fp->idx->moffs*sizeof(bgzidx1_t));
    fp->idx->offs[0].caddr = fp->idx->offs[0].uaddr = 0;

    int i;
    if ( fp->is_be )
    {
        int ret = 0;
        for (i=1; i<fp->idx->noffs; i++)
        {
            ret += fread(&x, 1, sizeof(x), idx); fp->idx->offs[i].caddr = ed_swap_8(x);
            ret += fread(&x, 1, sizeof(x), idx); fp->idx->offs[i].uaddr = ed_swap_8(x);
        }
        if ( ret != sizeof(x)*2*(fp->idx->noffs-1) ) return -1;
    }
    else
    {
        int ret = 0;
        for (i=1; i<fp->idx->noffs; i++)
        {
            ret += fread(&x, 1, sizeof(x), idx); fp->idx->offs[i].caddr = x;
            ret += fread(&x, 1, sizeof(x), idx); fp->idx->offs[i].uaddr = x;
        }
        if ( ret != sizeof(x)*2*(fp->idx->noffs-1) ) return -1;
    }
    fclose(idx);
    return 0;

}